

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_widget.cpp
# Opt level: O0

void __thiscall nesvis::PpuWidget::draw_patterntables(PpuWidget *this)

{
  bool bVar1;
  reference pvVar2;
  Vector2<float> local_30;
  int local_28;
  int i_1;
  uint local_1c;
  int i;
  PpuWidget *local_10;
  PpuWidget *this_local;
  
  local_10 = this;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe8,0.0,0.0);
  bVar1 = ImGui::Button("Read data",(ImVec2 *)&stack0xffffffffffffffe8);
  if (bVar1) {
    load_pattern_tables(this);
  }
  ImGui::Text("Pattern table 0");
  for (local_1c = 0; (int)local_1c < 0x100; local_1c = local_1c + 1) {
    if ((int)local_1c % 0x10 != 0) {
      ImGui::SameLine(0.0,-1.0);
    }
    pvVar2 = std::array<sf::Texture,_512UL>::operator[]
                       (&this->pattern_table_textures_,(long)(int)local_1c);
    sf::Vector2<float>::Vector2((Vector2<float> *)&stack0xffffffffffffffdc,16.0,16.0);
    ImGui::Image(pvVar2,(Vector2f *)&stack0xffffffffffffffdc,(Color *)&sf::Color::White,
                 (Color *)&sf::Color::Transparent);
    bVar1 = ImGui::IsItemHovered(0);
    if (bVar1) {
      ImGui::BeginTooltip();
      ImGui::Text("Index: %02X",(ulong)local_1c);
      ImGui::EndTooltip();
    }
  }
  ImGui::Text("Pattern table 1");
  for (local_28 = 0x100; local_28 < 0x200; local_28 = local_28 + 1) {
    if (local_28 % 0x10 != 0) {
      ImGui::SameLine(0.0,-1.0);
    }
    pvVar2 = std::array<sf::Texture,_512UL>::operator[]
                       (&this->pattern_table_textures_,(long)local_28);
    sf::Vector2<float>::Vector2(&local_30,16.0,16.0);
    ImGui::Image(pvVar2,&local_30,(Color *)&sf::Color::White,(Color *)&sf::Color::Transparent);
    bVar1 = ImGui::IsItemHovered(0);
    if (bVar1) {
      ImGui::BeginTooltip();
      ImGui::Text("Index: %02X",(ulong)(local_28 - 0x100));
      ImGui::EndTooltip();
    }
  }
  return;
}

Assistant:

void PpuWidget::draw_patterntables() {
    if (ImGui::Button("Read data")) {
        load_pattern_tables();
    }

    ImGui::Text("Pattern table 0");
    for (int i = 0; i < kPatternTableSize; ++i) {
        if (i % 16 != 0) {
            ImGui::SameLine();
        }
        ImGui::Image(pattern_table_textures_[i], {kSpriteSize, kSpriteSize});
        if (ImGui::IsItemHovered()) {
            ImGui::BeginTooltip();
            ImGui::Text("Index: %02X", i);
            ImGui::EndTooltip();
        }
    }
    ImGui::Text("Pattern table 1");
    for (int i = kPatternTableSize; i < kPatternTableSize * 2; ++i) {
        if (i % 16 != 0) {
            ImGui::SameLine();
        }
        ImGui::Image(pattern_table_textures_[i], {kSpriteSize, kSpriteSize});
        if (ImGui::IsItemHovered()) {
            ImGui::BeginTooltip();
            ImGui::Text("Index: %02X", i - kPatternTableSize);
            ImGui::EndTooltip();
        }
    }
}